

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

string * tinyusdz::buildEscapedAndQuotedStringForUSDA(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  bool bVar2;
  string sStack_88;
  string delim;
  string local_48;
  
  bVar1 = hasNewline(str);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (bVar1) {
    bVar1 = hasTripleQuotes(str,false);
    bVar2 = hasTripleQuotes(str,true);
    ::std::__cxx11::string::string((string *)&delim,"\"\"\"",(allocator *)&sStack_88);
    if (!bVar1 || !bVar2) {
      if (!bVar1) {
        if (bVar2) {
LAB_0021577a:
          ::std::__cxx11::string::assign((char *)&delim);
        }
LAB_00215784:
        ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        goto LAB_0021578f;
      }
      goto LAB_00215749;
    }
LAB_00215736:
    bVar1 = true;
  }
  else {
    bVar1 = hasQuotes(str,false);
    bVar2 = hasQuotes(str,true);
    ::std::__cxx11::string::string((string *)&delim,"\"",(allocator *)&sStack_88);
    if (bVar1 && bVar2) goto LAB_00215736;
    if (!bVar1) {
      if (bVar2) goto LAB_0021577a;
      goto LAB_00215784;
    }
LAB_00215749:
    bVar1 = false;
  }
  escapeSingleQuote(&sStack_88,str,bVar1);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_88);
  ::std::__cxx11::string::_M_dispose();
LAB_0021578f:
  escapeControlSequence(&local_48,__return_storage_ptr__);
  quote(&sStack_88,&local_48,&delim);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_88);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string buildEscapedAndQuotedStringForUSDA(const std::string &str) {
  // Rule for triple quote string:
  //
  // if str contains newline
  //   if str contains """ and '''
  //      use quote """ and escape " to \\", no escape for '''
  //   elif str contains """ only
  //      use quote ''' and no escape for """
  //   elif str contains ''' only
  //      use quote """ and no escape for '''
  //   else
  //      use quote """
  //
  // Rule for single quote string
  //   if str contains " and '
  //      use quote " and escape " to \\", no escape for '
  //   elif str contains " only
  //      use quote ' and no escape for "
  //   elif str contains ' only
  //      use quote " and no escape for '
  //   else
  //      use quote "

  bool has_newline = hasNewline(str);

  std::string s;

  if (has_newline) {
    bool has_triple_single_quoted_string = hasTripleQuotes(str, false);
    bool has_triple_double_quoted_string = hasTripleQuotes(str, true);

    std::string delim = "\"\"\"";
    if (has_triple_single_quoted_string && has_triple_double_quoted_string) {
      s = escapeSingleQuote(str, true);
    } else if (has_triple_single_quoted_string) {
      s = escapeSingleQuote(str, false);
    } else if (has_triple_double_quoted_string) {
      delim = "'''";
      s = str;
    } else {
      s = str;
    }

    s = quote(escapeControlSequence(s), delim);

  } else {
    // single quote string.
    bool has_single_quote = hasQuotes(str, false);
    bool has_double_quote = hasQuotes(str, true);

    std::string delim = "\"";
    if (has_single_quote && has_double_quote) {
      s = escapeSingleQuote(str, true);
    } else if (has_single_quote) {
      s = escapeSingleQuote(str, false);
    } else if (has_double_quote) {
      delim = "'";
      s = str;
    } else {
      s = str;
    }

    s = quote(escapeControlSequence(s), delim);
  }

  return s;
}